

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O2

void P_TranslateLineDef(line_t *ld,maplinedef_t *mld,int lineindexforid)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  bool bVar5;
  FLineTrans *pFVar6;
  int tag;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  bool bVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  ulong uVar16;
  FXlatExprState *pFVar17;
  char *pcVar18;
  uint uVar19;
  int *piVar20;
  FXlatExprState state;
  
  uVar3 = mld->special;
  tag = (int)mld->tag;
  uVar9 = (uint)mld->flags;
  for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
    if (((mld->flags >> ((uint)lVar13 & 0x1f) & 1) != 0) &&
       (LineFlagTranslations[lVar13].ismask == true)) {
      uVar9 = uVar9 & LineFlagTranslations[lVar13].newvalue;
    }
  }
  uVar19 = 0;
  bVar5 = false;
  for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
    if (((uVar9 >> ((uint)lVar13 & 0x1f) & 1) != 0) &&
       (LineFlagTranslations[lVar13].ismask == false)) {
      uVar10 = LineFlagTranslations[lVar13].newvalue;
      if (uVar10 == 0xfffffffd) {
        ld->alpha = 0.25;
      }
      else if (uVar10 == 0xffffffff) {
        bVar5 = true;
      }
      else if (uVar10 == 0xfffffffe) {
        ld->alpha = 0.75;
      }
      else {
        uVar19 = uVar19 | uVar10;
      }
    }
  }
  if (-1 < lineindexforid) {
    FTagManager::AddLineID(&tagManager,lineindexforid,tag);
  }
  pFVar6 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array;
  uVar9 = (uint)uVar3;
  if (uVar9 == 0) {
    ld->special = 0;
    ld->flags = uVar19;
    ld->args[0] = (int)mld->tag;
    ld->args[1] = 0;
    ld->args[2] = 0;
    ld->args[3] = 0;
    ld->args[4] = 0;
  }
  else {
    if ((uVar9 < SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Count) &&
       (SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[uVar3].special != 0)) {
      ld->special = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[uVar3].special
      ;
      uVar19 = (pFVar6[uVar3].flags & 0x20U) << 0x12 | (pFVar6[uVar3].flags & 0x1fU) << 9 | uVar19;
      uVar10 = uVar19 >> 10 & 7;
      uVar11 = 1 << (sbyte)uVar10;
      ld->activation = uVar11;
      if ((uVar10 | 4) == 7) {
        ld->activation = 0x28;
        uVar11 = 0x28;
      }
      ld->flags = uVar19 & 0xffffe3ff;
      if ((bVar5) && (uVar11 == 2)) {
        ld->activation = 0x40;
      }
      piVar20 = ld->args;
      state.linetype = uVar9;
      state.tag = tag;
      for (lVar13 = 0; lVar13 != 10; lVar13 = lVar13 + 2) {
        iVar7 = *(int *)((long)pFVar6[uVar3].args + lVar13 * 2);
        switch(pFVar6[uVar3].flags >> ((char)lVar13 + 0x14U & 0x1f) & 3) {
        case 1:
          iVar7 = tag;
        case 0:
          *piVar20 = iVar7;
          break;
        case 2:
          state.bIsConstant = true;
          (*XlatExprEval[XlatExpressions.Array[iVar7]])
                    (piVar20,XlatExpressions.Array + iVar7,&state);
          break;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_xlat.cpp"
                        ,0xaa,"void P_TranslateLineDef(line_t *, maplinedef_t *, int)");
        }
        piVar20 = piVar20 + 1;
      }
      if ((ld->flags & 0x20) == 0) {
        return;
      }
      if ((ld->activation & 0x42) == 0) {
        return;
      }
      ld->flags = ld->flags & 0xffffdfff;
      return;
    }
    uVar8 = 0;
    uVar16 = (ulong)(uint)NumBoomish;
    if (NumBoomish < 1) {
      uVar16 = uVar8;
    }
    for (; uVar16 * 0x18 - uVar8 != 0; uVar8 = uVar8 + 0x18) {
      if ((*(ushort *)((long)&Boomish[0].FirstLinetype + uVar8) <= uVar3) &&
         (uVar3 <= *(ushort *)((long)&Boomish[0].LastLinetype + uVar8))) {
        bVar1 = (&Boomish[0].NewSpecial)[uVar8];
        ld->special = (uint)bVar1;
        switch(uVar9 & 7) {
        case 1:
          uVar19 = uVar19 | 0x200;
        case 0:
          ld->activation = 1;
          bVar5 = false;
          goto LAB_00468719;
        case 3:
        case 7:
          uVar19 = uVar19 | 0x200;
        default:
          if (bVar5) {
            ld->activation = 0x40;
          }
          else {
            ld->activation = 2;
          }
          break;
        case 5:
          uVar19 = uVar19 | 0x200;
        case 4:
          ld->activation = 8;
        }
        bVar5 = true;
LAB_00468719:
        ld->args[0] = tag;
        ld->args[1] = 0;
        ld->args[2] = 0;
        ld->args[3] = 0;
        ld->args[4] = 0;
        lVar13 = 0;
        uVar16 = 0;
        goto LAB_00468736;
      }
    }
    ld->special = 0;
    ld->flags = uVar19;
    ld->args[0] = 0;
    ld->args[1] = 0;
    ld->args[2] = 0;
    ld->args[3] = 0;
    ld->args[4] = 0;
  }
  return;
LAB_00468736:
  if (*(uint *)((long)&Boomish[0].Args.Count + uVar8) <= uVar16) {
    if ((~uVar3 & 6) == 0) {
      if (bVar1 == 0xca) {
        *(byte *)(ld->args + 2) = (byte)ld->args[2] | 0x80;
      }
      else {
        ld->args[0] = 0;
      }
    }
    ld->flags = uVar19;
    if ((uVar19 >> 0xd & 1) == 0 || bVar5) {
      return;
    }
    ld->activation = 0x80;
    return;
  }
  lVar4 = *(long *)((long)&Boomish[0].Args.Array + uVar8);
  bVar2 = *(byte *)(lVar4 + 3 + uVar16 * 0x36);
  if ((ulong)bVar2 < 4) {
    pFVar17 = (FXlatExprState *)(ld->args + (ulong)bVar2 + 1);
  }
  else {
    state.linetype = uVar19 >> 9 & 0x3f;
    pFVar17 = &state;
  }
  pcVar18 = (char *)(uVar16 * 0x36 + lVar4);
  if ((ulong)(byte)pcVar18[2] == 0) {
    bVar15 = pcVar18[4];
LAB_004687c6:
    uVar9 = (uint)bVar15;
    if (*pcVar18 == '\x01') {
      uVar9 = (uint)bVar15 | pFVar17->linetype;
    }
    pFVar17->linetype = uVar9;
    if (bVar2 == 4) {
      uVar19 = uVar19 & 0xffff81ff | state.linetype << 9;
    }
  }
  else {
    bVar15 = 0;
    bVar12 = false;
    for (uVar14 = 0; (byte)pcVar18[2] != uVar14; uVar14 = uVar14 + 1) {
      if ((*(ushort *)(pcVar18 + 6) & uVar3) == *(ushort *)(lVar4 + lVar13 + 8 + uVar14 * 2)) {
        bVar15 = *(byte *)(lVar4 + lVar13 + 0x26 + uVar14);
        bVar12 = true;
      }
    }
    if (bVar12) goto LAB_004687c6;
  }
  uVar16 = uVar16 + 1;
  lVar13 = lVar13 + 0x36;
  goto LAB_00468736;
}

Assistant:

void P_TranslateLineDef (line_t *ld, maplinedef_t *mld, int lineindexforid)
{
	unsigned short special = (unsigned short) LittleShort(mld->special);
	short tag = LittleShort(mld->tag);
	DWORD flags = LittleShort(mld->flags);
	INTBOOL passthrough = 0;

	DWORD flags1 = flags;
	DWORD newflags = 0;

	for(int i=0;i<16;i++)
	{
		if ((flags & (1<<i)) && LineFlagTranslations[i].ismask)
		{
			flags1 &= LineFlagTranslations[i].newvalue;
		}
	}
	for(int i=0;i<16;i++)
	{
		if ((flags1 & (1<<i)) && !LineFlagTranslations[i].ismask)
		{
			switch (LineFlagTranslations[i].newvalue)
			{
			case -1:
				passthrough = true;
				break;
			case -2:
				ld->alpha = 0.75;
				break;
			case -3:
				ld->alpha = 0.25;
				break;
			default:
				newflags |= LineFlagTranslations[i].newvalue;
				break;
			}
		}
	}
	flags = newflags;

	if (lineindexforid >= 0)
	{
		// For purposes of maintaining BOOM compatibility, each
		// line also needs to have its ID set to the same as its tag.
		// An external conversion program would need to do this more
		// intelligently.
		tagManager.AddLineID(lineindexforid, tag);
	}

	// 0 specials are never translated.
	if (special == 0)
	{
		ld->special = 0;
		ld->flags = flags;
		ld->args[0] = mld->tag;
		memset (ld->args+1, 0, sizeof(ld->args)-sizeof(ld->args[0]));
		return;
	}

	FLineTrans *linetrans = NULL;
	if (special < SimpleLineTranslations.Size()) linetrans = &SimpleLineTranslations[special];
	if (linetrans != NULL && linetrans->special != 0)
	{
		ld->special = linetrans->special;

		ld->flags = flags | ((linetrans->flags & 0x1f) << 9);
		if (linetrans->flags & 0x20) ld->flags |= ML_FIRSTSIDEONLY;
		ld->activation = 1 << GET_SPAC(ld->flags);
		if (ld->activation == SPAC_AnyCross)
		{ // this is really PTouch
			ld->activation = SPAC_Impact|SPAC_PCross;
		}
		else if (ld->activation == SPAC_Impact)
		{ // In non-UMDF maps, Impact implies PCross
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		ld->flags &= ~ML_SPAC_MASK;

		if (passthrough && ld->activation == SPAC_Use)
		{
			ld->activation = SPAC_UseThrough;
		}
		// Set special arguments.
		FXlatExprState state;
		state.tag = tag;
		state.linetype = special;
		for (int t = 0; t < LINETRANS_MAXARGS; ++t)
		{
			int arg = linetrans->args[t];
			int argop = (linetrans->flags >> (LINETRANS_TAGSHIFT + t*TAGOP_NUMBITS)) & TAGOP_MASK;

			switch (argop)
			{
			case ARGOP_Const:
				ld->args[t] = arg;
				break;
			case ARGOP_Tag:
				ld->args[t] = tag;
				break;
			case ARGOP_Expr:
				{
					int *xnode = &XlatExpressions[arg];
					state.bIsConstant = true;
					XlatExprEval[*xnode](&ld->args[t], xnode, &state);
				}
				break;
			default:
				assert(0);
				ld->args[t] = 0;
				break;
			}
		}

		if ((ld->flags & ML_SECRET) && ld->activation & (SPAC_Use|SPAC_UseThrough))
		{
			ld->flags &= ~ML_MONSTERSCANACTIVATE;
		}
		return;
	}

	for(int i=0;i<NumBoomish;i++)
	{
		FBoomTranslator *b = &Boomish[i];

		if (special >= b->FirstLinetype && special <= b->LastLinetype)
		{
			ld->special = b->NewSpecial;

			switch (special & 0x0007)
			{
			case WalkMany:
				flags |= ML_REPEAT_SPECIAL;
			case WalkOnce:
				ld->activation = SPAC_Cross;
				break;

			case SwitchMany:
			case PushMany:
				flags |= ML_REPEAT_SPECIAL;
			case SwitchOnce:
			case PushOnce:
				if (passthrough)
					ld->activation = SPAC_UseThrough;
				else
					ld->activation = SPAC_Use;
				break;

			case GunMany:
				flags |= ML_REPEAT_SPECIAL;
			case GunOnce:
				ld->activation = SPAC_Impact;
				break;
			}

			ld->args[0] = tag;
			ld->args[1] = ld->args[2] = ld->args[3] = ld->args[4] = 0;

			for(unsigned j=0; j < b->Args.Size(); j++)
			{
				FBoomArg *arg = &b->Args[j];
				int *destp;
				int flagtemp;
				BYTE val = 0;	// quiet, GCC
				bool found;

				if (arg->ArgNum < 4)
				{
					destp = &ld->args[arg->ArgNum+1];
				}
				else
				{
					flagtemp = ((flags >> 9) & 0x3f);
					destp = &flagtemp;
				}
				if (arg->ListSize == 0)
				{
					val = arg->ConstantValue;
					found = true;
				}
				else
				{
					found = false;
					for (int k = 0; k < arg->ListSize; k++)
					{
						if ((special & arg->AndValue) == arg->ResultFilter[k])
						{
							val = arg->ResultValue[k];
							found = true;
						}
					}
				}
				if (found)
				{
					if (arg->bOrExisting)
					{
						*destp |= val;
					}
					else
					{
						*destp = val;
					}
					if (arg->ArgNum == 4)
					{
						flags = (flags & ~0x7e00) | (flagtemp << 9);
					}
				}
			}
			// We treat push triggers like switch triggers with zero tags.
			if ((special & 7) == PushMany || (special & 7) == PushOnce)
			{
				if (ld->special == Generic_Door)
				{
					ld->args[2] |= 128;
				}
				else
				{
					ld->args[0] = 0;
				}
			}
			ld->flags = flags;
			if (flags & ML_MONSTERSCANACTIVATE && ld->activation == SPAC_Cross)
			{
				// In Boom anything can activate such a line so set the proper type here.
				ld->activation = SPAC_AnyCross;
			}
			return;
		}
	}
	// Don't know what to do, so 0 it
	ld->special = 0;
	ld->flags = flags;
	memset (ld->args, 0, sizeof(ld->args));
}